

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64 max_value,uint64 *output)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  uint64 uVar7;
  ulong uVar8;
  bool bVar9;
  
  pcVar5 = (text->_M_dataplus)._M_p;
  uVar6 = 10;
  if (*pcVar5 == '0') {
    if ((byte)(pcVar5[1] | 0x20U) == 0x78) {
      pcVar5 = pcVar5 + 2;
      uVar6 = 0x10;
    }
    else {
      uVar6 = 8;
    }
  }
  cVar2 = *pcVar5;
  bVar9 = cVar2 == '\0';
  if (bVar9) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pcVar5 = pcVar5 + 1;
      iVar3 = (int)cVar2;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar4 = iVar3 - 0x30;
      }
      else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        uVar4 = iVar3 - 0x57;
      }
      else {
        uVar4 = iVar3 - 0x37;
        if (0x19 < (byte)(cVar2 + 0xbfU)) {
          uVar4 = 0xffffffff;
        }
      }
      if (uVar4 < uVar6) {
        uVar8 = (ulong)uVar4;
        if (max_value < uVar8) goto LAB_005cc6d1;
        bVar1 = false;
        if (uVar7 <= (max_value - uVar8) / (ulong)uVar6) {
          uVar7 = uVar7 * uVar6 + uVar8;
          bVar1 = true;
        }
      }
      else {
LAB_005cc6d1:
        bVar1 = false;
      }
      if (!bVar1) {
        return bVar9;
      }
      cVar2 = *pcVar5;
      bVar9 = cVar2 == '\0';
    } while (!bVar9);
  }
  *output = uVar7;
  return bVar9;
}

Assistant:

bool Tokenizer::ParseInteger(const string& text, uint64 max_value,
                             uint64* output) {
  // Sadly, we can't just use strtoul() since it is only 32-bit and strtoull()
  // is non-standard.  I hate the C standard library.  :(

//  return strtoull(text.c_str(), NULL, 0);

  const char* ptr = text.c_str();
  int base = 10;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
    }
  }

  uint64 result = 0;
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit > max_value || result > (max_value - digit) / base) {
      // Overflow.
      return false;
    }
    result = result * base + digit;
  }

  *output = result;
  return true;
}